

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O0

void __thiscall beast::unit_test::runner::pass<void>(runner *this)

{
  allocator local_39;
  string local_38;
  lock_guard<std::recursive_mutex> local_18;
  lock_guard<std::recursive_mutex> lock;
  runner *this_local;
  
  lock._M_device = (mutex_type *)this;
  ::std::lock_guard<std::recursive_mutex>::lock_guard(&local_18,(mutex_type *)&this->mutex_);
  if ((this->default_ & 1U) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"",&local_39);
    testcase<void>(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  (*this->_vptr_runner[6])();
  this->cond_ = true;
  ::std::lock_guard<std::recursive_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void
runner::pass()
{
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if(default_)
        testcase("");
    on_pass();
    cond_ = true;
}